

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

Array<capnp::word> *
capnp::serializeSegmentTable
          (Array<capnp::word> *__return_storage_ptr__,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  bool bVar1;
  size_t sVar2;
  word *this;
  ArrayPtr<const_capnp::word> *this_00;
  uint local_84;
  uint i;
  WireValue<uint32_t> *table;
  Fault local_68;
  Fault f;
  size_t local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  Array<capnp::word> *result;
  
  _kjCondition._32_8_ = segments.ptr;
  local_58 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
  local_50 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_48,&local_50,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
    kj::heapArray<capnp::word>(__return_storage_ptr__,(sVar2 >> 1) + 1);
    this = kj::Array<capnp::word>::begin(__return_storage_ptr__);
    sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
    _::DirectWireValue<unsigned_int>::set((DirectWireValue<unsigned_int> *)this,(int)sVar2 - 1);
    for (local_84 = 0;
        sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                          ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result)
        , local_84 < sVar2; local_84 = local_84 + 1) {
      this_00 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                          ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result,
                           (ulong)local_84);
      sVar2 = kj::ArrayPtr<const_capnp::word>::size(this_00);
      _::DirectWireValue<unsigned_int>::set
                ((DirectWireValue<unsigned_int> *)((long)&this->content + (ulong)(local_84 + 1) * 4)
                 ,(uint)sVar2);
    }
    sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
    if ((sVar2 & 1) == 0) {
      sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
      _::DirectWireValue<unsigned_int>::set
                ((DirectWireValue<unsigned_int> *)((long)&this->content + sVar2 * 4 + 4),0);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[42]>
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
             ,0x114,FAILED,"segments.size() > 0",
             "_kjCondition,\"Tried to serialize uninitialized message.\"",
             (DebugComparison<unsigned_long,_int> *)local_48,
             (char (*) [42])"Tried to serialize uninitialized message.");
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

kj::Array<word> serializeSegmentTable(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");
  
  auto result = kj::heapArray<word>(segments.size() / 2 + 1);
  auto table = reinterpret_cast<_::WireValue<uint32_t>*>(result.begin());

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);
  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }
  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  return result;
}